

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmkicon.c
# Opt level: O2

Pixmap make_Xicon(DspInterface dsp)

{
  Display *pDVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int y_hot;
  int x_hot;
  uint height;
  uint width;
  undefined8 local_98;
  undefined8 uStack_90;
  uint8_t *local_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_18 = 0;
  local_68 = 0;
  uStack_60 = 0;
  piVar4 = &y_hot;
  piVar3 = &x_hot;
  iVar2 = XReadBitmapFile(dsp->display_id,*(undefined8 *)(*(long *)(dsp->display_id + 0xe8) + 0x10),
                          iconpixmapfile,&width,&height,&IconPixmap,piVar3,piVar4);
  if (iVar2 == 1) {
    local_98 = 0x3a00000058;
    uStack_90 = 0;
    local_88 = Lisp_icon;
    local_70 = 0xb00000001;
    local_80 = 0;
    uStack_7c = 8;
    uStack_78 = 1;
    uStack_74 = 0;
    pDVar1 = dsp->display_id;
    IconPixmap = XCreatePixmap(pDVar1,dsp->LispWindow,0x58,0x3a,
                               *(undefined4 *)
                                (*(long *)(pDVar1 + 0xe8) + 0x38 +
                                (long)*(int *)(pDVar1 + 0xe0) * 0x80));
    XPutImage(dsp->display_id,IconPixmap,dsp->Copy_GC,&local_98,0,0,
              (ulong)piVar3 & 0xffffffff00000000,(ulong)piVar4 & 0xffffffff00000000,0x58,0x3a);
  }
  else if (iVar2 == 2) {
    fprintf(_stderr,"Iconpixmapfile %s contains invalid bitmap data\n",iconpixmapfile);
  }
  else if (iVar2 == 3) {
    fwrite("Not enough memory to allocate icon pixmap\n",0x2a,1,_stderr);
  }
  return IconPixmap;
}

Assistant:

Pixmap make_Xicon(DspInterface dsp)
{
  unsigned int width, height;
  int value, x_hot, y_hot;
  XImage IconImage = {0};


#ifdef TRACE
  printf("In make_Xicon().\n");
#endif
  value = XReadBitmapFile(dsp->display_id, RootWindow(dsp->display_id, 0), iconpixmapfile, &width,
                          &height, &IconPixmap, &x_hot, &y_hot);
  if (value == BitmapOpenFailed) {
    IconImage.width = Lisp_icon_width;
    IconImage.height = Lisp_icon_height;
    IconImage.xoffset = 0;
    IconImage.format = XYBitmap;
    IconImage.data = (char *)Lisp_icon;
#if defined(BYTESWAP)
    IconImage.byte_order = LSBFirst;
#else  /* BYTESWAP */
    IconImage.byte_order = MSBFirst;
#endif /* BYTESWAP */
    IconImage.bitmap_unit = 8;
    IconImage.bitmap_pad = 0;
    IconImage.depth = 1;
    IconImage.bytes_per_line = Lisp_icon_width / 8;
#if defined(X_ICON_IN_X_BITMAP_FORMAT)
    IconImage.bitmap_bit_order = LSBFirst;
#else
    IconImage.bitmap_bit_order = MSBFirst;
#endif

    IconPixmap = XCreatePixmap(
        dsp->display_id, dsp->LispWindow, Lisp_icon_width, Lisp_icon_height,
        (unsigned)DefaultDepthOfScreen(ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id))));

    XPutImage(dsp->display_id, IconPixmap, dsp->Copy_GC, &IconImage, 0, 0, 0, 0, Lisp_icon_width,
              Lisp_icon_height);

  } else if (value == BitmapFileInvalid)
    (void)fprintf(stderr, "Iconpixmapfile %s contains invalid bitmap data\n", iconpixmapfile);
  else if (value == BitmapNoMemory)
    (void)fprintf(stderr, "Not enough memory to allocate icon pixmap\n");
  return (IconPixmap);
}